

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMemCheckHandler::PopulateCustomVectors(cmCTestMemCheckHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  allocator<char> local_39;
  string local_38;
  
  cmCTestTestHandler::PopulateCustomVectors(&this->super_cmCTestTestHandler,mf);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_PRE_MEMCHECK",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPreMemCheck);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_POST_MEMCHECK",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPostMemCheck);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_MEMCHECK_IGNORE",&local_39);
  cmCTest::PopulateCustomVector
            (pcVar1,mf,&local_38,&(this->super_cmCTestTestHandler).CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCTestMemCheckHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->cmCTestTestHandler::PopulateCustomVectors(mf);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_MEMCHECK",
                                    this->CustomPreMemCheck);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_MEMCHECK",
                                    this->CustomPostMemCheck);

  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_MEMCHECK_IGNORE",
                                    this->CustomTestsIgnore);
}